

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinRange
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  const_reference pvVar1;
  HeapThunk *this_00;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  anon_union_8_3_4e909c26_for_v this_01;
  iterator in_RSI;
  Interpreter *in_RDI;
  Value VVar2;
  HeapThunk *th;
  int i;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *elements;
  long len;
  long to;
  long from;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_00000190;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_00000198;
  string *in_stack_000001a0;
  LocationRange *in_stack_000001a8;
  Interpreter *in_stack_000001b0;
  Value *in_stack_fffffffffffffea8;
  Interpreter *in_stack_fffffffffffffeb0;
  value_type *__x;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_fffffffffffffec0;
  allocator_type *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  uint in_stack_ffffffffffffff10;
  HeapThunk *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int iVar3;
  Interpreter *this_03;
  value_type local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  Type local_b0;
  undefined4 uStack_ac;
  anon_union_8_3_4e909c26_for_v local_a8;
  long local_a0;
  long local_98;
  long local_90;
  allocator_type local_81;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 *local_78;
  undefined8 local_70;
  undefined1 local_39 [33];
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_18;
  
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_39;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)in_RSI,(allocator<char> *)in_RDI);
  local_80 = 2;
  local_7c = 2;
  local_78 = &local_80;
  local_70 = 2;
  __a = &local_81;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x22d587);
  __l._M_len = (size_type)this_02;
  __l._M_array = in_RSI;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)in_RDI,__l,__a);
  validateBuiltinArgs(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,in_stack_00000198,
                      in_stack_00000190);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector(in_stack_fffffffffffffec0);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x22d5eb);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  pvVar1 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_18,0);
  local_90 = (long)(pvVar1->v).d;
  pvVar1 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_18,1);
  local_98 = (long)(pvVar1->v).d;
  local_a0 = (local_98 - local_90) + 1;
  local_c8 = (value_type)0x0;
  uStack_c0 = 0;
  local_b8 = 0;
  __x = &local_c8;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
            *)0x22d68b);
  VVar2 = makeArray(in_stack_fffffffffffffeb0,
                    (vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                     *)in_stack_fffffffffffffea8);
  this_01 = VVar2.v;
  local_b0 = VVar2.t;
  *(ulong *)&in_RDI->scratch = CONCAT44(uStack_ac,local_b0);
  (in_RDI->scratch).v.h = (HeapEntity *)this_01;
  local_a8 = this_01;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::~vector((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
             *)this_01.h);
  if (0 < local_a0) {
    this_03 = (Interpreter *)((in_RDI->scratch).v.h + 1);
    for (iVar3 = 0; iVar3 < local_a0; iVar3 = iVar3 + 1) {
      this_00 = (anonymous_namespace)::Interpreter::
                makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                          (this_03,(Identifier **)CONCAT44(iVar3,in_stack_ffffffffffffff28),
                           (void **)in_stack_ffffffffffffff20,(int *)0x0,
                           (void **)(ulong)in_stack_ffffffffffffff10);
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)this_01.h,__x);
      in_stack_ffffffffffffff20 = this_00;
      makeNumber(in_RDI,(double)(local_90 + iVar3));
      HeapThunk::fill(this_00,in_stack_fffffffffffffea8);
    }
  }
  return (AST *)0x0;
}

Assistant:

const AST *builtinRange(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "range", args, {Value::NUMBER, Value::NUMBER});
        long from = long(args[0].v.d);
        long to = long(args[1].v.d);
        long len = to - from + 1;
        scratch = makeArray({});
        if (len > 0) {
            auto &elements = static_cast<HeapArray *>(scratch.v.h)->elements;
            for (int i = 0; i < len; ++i) {
                auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
                elements.push_back(th);
                th->fill(makeNumber(from + i));
            }
        }
        return nullptr;
    }